

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_instructions(vec *instructions,int format_blank_count,_Bool format_is_block)

{
  instruction *inst;
  int iVar1;
  uint64 uVar2;
  
  if (instructions->size != 0) {
    uVar2 = 0;
    do {
      printf("             ");
      if ((format_is_block) && (instructions->size - 1 == uVar2)) {
        iVar1 = format_blank_count + -2;
        if (2 < format_blank_count) {
          do {
            putchar(0x20);
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
      }
      else {
        iVar1 = format_blank_count;
        if (0 < format_blank_count) {
          do {
            putchar(0x20);
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
      }
      inst = (instruction *)(*instructions->get_ele)(instructions,uVar2);
      print_instruction(inst,format_blank_count);
      uVar2 = uVar2 + 1;
    } while (uVar2 < instructions->size);
  }
  return;
}

Assistant:

void print_instructions(vec *instructions, int format_blank_count, bool format_is_block) {
    for (int i = 0; i < instructions->size; ++i) {
        printf("             ");
        if (format_is_block && i == instructions->size - 1) {
            for (int j = 0; j < format_blank_count - 2; ++j) {
                printf(" ");
            }
        } else {
            for (int j = 0; j < format_blank_count; ++j) {
                printf(" ");
            }
        }
        print_instruction((instruction *) (instructions->get_ele(instructions, i)), format_blank_count);
    }
}